

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
::rehash(raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
         *this,size_t n)

{
  long lVar1;
  ulong uVar2;
  size_t new_capacity;
  Layout LVar3;
  
  if (n != 0 || this->capacity_ != 0) {
    uVar2 = this->size_;
    if (n == 0 && uVar2 == 0) {
      if (this->capacity_ != 0) {
        LVar3 = MakeLayout(this->capacity_);
        Deallocate<4ul,std::allocator<std::pair<int_const,int>>>
                  ((allocator<std::pair<const_int,_int>_> *)&this->settings_,this->ctrl_,
                   (LVar3.
                    super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<int,_int>_>
                    .size_[0] + 3 & 0xfffffffffffffffc) +
                   LVar3.
                   super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<int,_int>_>
                   .size_[1] * 8);
        this->ctrl_ = EmptyGroup<std::is_same<std::allocator<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>>()
                      ::empty_group;
        (this->settings_).
        super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
        .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
        this->slots_ = (slot_type *)0x0;
        this->size_ = 0;
        this->capacity_ = 0;
      }
      return;
    }
    if (uVar2 <= n) {
      uVar2 = n;
    }
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    new_capacity = 1;
    if (uVar2 != 0) {
      new_capacity = 0xffffffffffffffff >> (~(byte)lVar1 & 0x3f);
    }
    if ((n == 0) || (this->capacity_ < new_capacity)) {
      resize(this,new_capacity);
      return;
    }
  }
  return;
}

Assistant:

void rehash(size_t n) {
        if (n == 0 && capacity_ == 0) return;
        if (n == 0 && size_ == 0) {
            destroy_slots();
            infoz_.RecordStorageChanged(0, 0);
            return;
        }
        // bitor is a faster way of doing `max` here. We will round up to the next
        // power-of-2-minus-1, so bitor is good enough.
        auto m = NormalizeCapacity((std::max)(n, size()));
        // n == 0 unconditionally rehashes as per the standard.
        if (n == 0 || m > capacity_) {
            resize(m);
        }
    }